

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O0

void __thiscall ResolverThread::stop(ResolverThread *this)

{
  function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)> local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  ResolverThread *local_10;
  ResolverThread *this_local;
  
  local_10 = this;
  std::atomic<bool>::operator=(&this->keep_running,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",&local_69);
  std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
  function(&local_90,(nullptr_t)0x0);
  resolve(this,&local_30,&local_68,(EventLoop *)0x0,&local_90);
  std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
  ~function(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void ResolverThread::stop() {
    keep_running = false;
    resolve("", "", nullptr, nullptr);
}